

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DTDScanner::scanEnumeration
          (DTDScanner *this,DTDAttDef *attDef,XMLBuffer *toFill,bool notation)

{
  XMLBufferMgr *this_00;
  ReaderMgr *pRVar1;
  XMLSize_t XVar2;
  XMLCh *chars;
  XMLScanner *this_01;
  bool bVar3;
  int iVar4;
  XMLBuffer *toFill_00;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  int iVar5;
  XMLBufBid bbTmp;
  
  toFill->fIndex = 0;
  checkForPERef(this,false,true);
  if (((int)CONCAT71(in_register_00000009,notation) != 0) &&
     (bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'('), !bVar3)) {
    XMLScanner::emitError(this->fScanner,ExpectedOpenParen);
  }
  this_00 = this->fBufMgr;
  toFill_00 = XMLBufferMgr::bidOnBuffer(this_00);
  do {
    checkForPERef(this,false,true);
    pRVar1 = this->fReaderMgr;
    toFill_00->fIndex = 0;
    bVar3 = XMLReader::getName(pRVar1->fCurReader,toFill_00,!notation);
    if (bVar3) {
      XVar2 = toFill_00->fIndex;
      chars = toFill_00->fBuffer;
      chars[XVar2] = L'\0';
      XMLBuffer::append(toFill,chars,XVar2);
      checkForPERef(this,false,true);
      bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L')');
      iVar5 = 3;
      if (!bVar3) {
        if (toFill->fIndex == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
        }
        XVar2 = toFill->fIndex;
        toFill->fIndex = XVar2 + 1;
        toFill->fBuffer[XVar2] = L' ';
        bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'|');
        iVar5 = 0;
        if (!bVar3) {
          iVar5 = 1;
          XMLScanner::emitError(this->fScanner,ExpectedEnumSepOrParen);
        }
      }
    }
    else {
      this_01 = this->fScanner;
      iVar4 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
      iVar5 = 1;
      XMLScanner::emitError
                (this_01,ExpectedEnumValue,(XMLCh *)CONCAT44(extraout_var,iVar4),(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
    }
  } while (iVar5 == 0);
  XMLBufferMgr::releaseBuffer(this_00,toFill_00);
  return iVar5 == 3;
}

Assistant:

bool DTDScanner::scanEnumeration( const   DTDAttDef&  attDef
                                    ,       XMLBuffer&  toFill
                                    , const bool        notation)
{
    // Reset the passed buffer
    toFill.reset();

    // Check for PE ref but don't require space
    checkForPERef(false, true);

    // If this is a notation, we need an opening paren
    if (notation)
    {
        if (!fReaderMgr->skippedChar(chOpenParen))
            fScanner->emitError(XMLErrs::ExpectedOpenParen);
    }

    // We need a local buffer to use as well
    XMLBufBid bbTmp(fBufMgr);

    while (true)
    {
        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // And then get either a name or a name token
        bool success;
        if (notation)
            success = fReaderMgr->getName(bbTmp.getBuffer());
        else
            success = fReaderMgr->getNameToken(bbTmp.getBuffer());

        if (!success)
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedEnumValue
                , attDef.getFullName()
            );
            return false;
        }

        // Append this value to the target value
        toFill.append(bbTmp.getRawBuffer(), bbTmp.getLen());

        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // Check for the terminating paren
        if (fReaderMgr->skippedChar(chCloseParen))
            break;

        // And append a space separator
        toFill.append(chSpace);

        // Check for the pipe character separator
        if (!fReaderMgr->skippedChar(chPipe))
        {
            fScanner->emitError(XMLErrs::ExpectedEnumSepOrParen);
            return false;
        }
    }
    return true;
}